

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void fts3NodeFree(SegmentNode *pTree)

{
  SegmentNode *pSVar1;
  SegmentNode *pRight;
  SegmentNode *p;
  SegmentNode *pTree_local;
  
  if (pTree != (SegmentNode *)0x0) {
    pRight = pTree->pLeftmost;
    fts3NodeFree(pRight->pParent);
    while (pRight != (SegmentNode *)0x0) {
      pSVar1 = pRight->pRight;
      if ((SegmentNode *)pRight->aData != pRight + 1) {
        sqlite3_free(pRight->aData);
      }
      sqlite3_free(pRight->zMalloc);
      sqlite3_free(pRight);
      pRight = pSVar1;
    }
  }
  return;
}

Assistant:

static void fts3NodeFree(SegmentNode *pTree){
  if( pTree ){
    SegmentNode *p = pTree->pLeftmost;
    fts3NodeFree(p->pParent);
    while( p ){
      SegmentNode *pRight = p->pRight;
      if( p->aData!=(char *)&p[1] ){
        sqlite3_free(p->aData);
      }
      assert( pRight==0 || p->zMalloc==0 );
      sqlite3_free(p->zMalloc);
      sqlite3_free(p);
      p = pRight;
    }
  }
}